

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i,real a)

{
  size_t sVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  int64_t iVar4;
  size_t sVar5;
  real *prVar6;
  int64_t j;
  long j_00;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x91,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  iVar4 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar4) {
    sVar1 = (x->data_).size_;
    sVar5 = Matrix::size(&this->super_Matrix,1);
    if (sVar1 == sVar5) {
      for (j_00 = 0; j_00 < (this->super_Matrix).n_; j_00 = j_00 + 1) {
        prVar6 = at(this,(ulong)(uint)i,j_00);
        pfVar2 = (x->data_).mem_;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)*prVar6),ZEXT416((uint)a),ZEXT416((uint)pfVar2[j_00])
                                );
        pfVar2[j_00] = auVar3._0_4_;
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0x93,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                ,0x92,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += a * at(i, j);
  }
}